

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O3

string * __thiscall
deqp::gls::ShaderExecUtil::generateVertexShaderForTess_abi_cxx11_
          (string *__return_storage_ptr__,ShaderExecUtil *this,GLSLVersion version)

{
  char *__s;
  size_t sVar1;
  string *psVar2;
  ostringstream src;
  undefined1 auStack_198 [8];
  long local_190 [14];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  __s = glu::getGLSLVersionDeclaration((GLSLVersion)this);
  if (__s == (char *)0x0) {
    std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"void main (void)\n{\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"\tgl_Position = vec4(gl_VertexID/2, gl_VertexID%2, 0.0, 1.0);\n",
             0x3d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  psVar2 = (string *)std::ios_base::~ios_base(local_120);
  return psVar2;
}

Assistant:

static std::string generateVertexShaderForTess (glu::GLSLVersion version)
{
	std::ostringstream	src;

	src << glu::getGLSLVersionDeclaration(version) << "\n";

	src << "void main (void)\n{\n"
		<< "	gl_Position = vec4(gl_VertexID/2, gl_VertexID%2, 0.0, 1.0);\n"
		<< "}\n";

	return src.str();
}